

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

void Curl_infof(Curl_easy *data,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *format;
  char *buffer;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t sStack_8f0;
  va_list ap;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  char print_buffer [2049];
  
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x87b & 0x40) != 0)) {
    ap[0].gp_offset = 0x10;
    ap[0].fp_offset = 0x30;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].reg_save_area = local_8c8;
    local_8b8 = in_RDX;
    local_8b0 = in_RCX;
    local_8a8 = in_R8;
    local_8a0 = in_R9;
    uVar1 = curl_mvsnprintf(print_buffer,0x801,fmt,ap);
    if (0x800 < uVar1) {
      sVar2 = strlen(fmt);
      if (fmt[sVar2 - 1] == '\n') {
        buffer = print_buffer + 0x7fc;
        format = "...\n";
        sStack_8f0 = 5;
      }
      else {
        buffer = print_buffer + 0x7fd;
        format = "...";
        sStack_8f0 = 4;
      }
      curl_msnprintf(buffer,sStack_8f0,format);
    }
    sVar2 = strlen(print_buffer);
    Curl_debug(data,CURLINFO_TEXT,print_buffer,sVar2);
  }
  return;
}

Assistant:

void Curl_infof(struct Curl_easy *data, const char *fmt, ...)
{
  if(data && data->set.verbose) {
    va_list ap;
    size_t len;
    char print_buffer[2048 + 1];
    va_start(ap, fmt);
    len = mvsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    /*
     * Indicate truncation of the input by replacing the last 3 characters
     * with "...", and transfer the newline over in case the format had one.
     */
    if(len >= sizeof(print_buffer)) {
      len = strlen(fmt);
      if(fmt[--len] == '\n')
        msnprintf(print_buffer + (sizeof(print_buffer) - 5), 5, "...\n");
      else
        msnprintf(print_buffer + (sizeof(print_buffer) - 4), 4, "...");
    }
    va_end(ap);
    len = strlen(print_buffer);
    Curl_debug(data, CURLINFO_TEXT, print_buffer, len);
  }
}